

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

DdNode * Llb_Nonlin4ComputeInitState(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder,int fBackward)

{
  abctime aVar1;
  int i;
  DdNode *n;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar2;
  DdNode *pDVar3;
  int i_00;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  n = Cudd_ReadOne(dd);
  Cudd_Ref(n);
  for (i_00 = 0; i_00 < pAig->nRegs; i_00 = i_00 + 1) {
    pObj = Saig_ManLi(pAig,i_00);
    pAVar2 = Saig_ManLo(pAig,i_00);
    if (fBackward == 0) {
      pObj = pAVar2;
    }
    i = Llb_ObjBddVar(vOrder,pObj);
    pDVar3 = Cudd_bddIthVar(dd,i);
    pDVar3 = Cudd_bddAnd(dd,n,(DdNode *)((ulong)pDVar3 ^ 1));
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,n);
    n = pDVar3;
  }
  Cudd_Deref(n);
  dd->TimeStop = aVar1;
  return n;
}

Assistant:

DdNode * Llb_Nonlin4ComputeInitState( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder, int fBackward )
{
    Aig_Obj_t * pObjLi, * pObjLo;
    DdNode * bRes, * bVar, * bTemp;
    int i;
    abctime TimeStop;
    TimeStop = dd->TimeStop;  dd->TimeStop = 0;
    bRes = Cudd_ReadOne( dd );   Cudd_Ref( bRes );
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
    {
        bVar = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, fBackward? pObjLi : pObjLo) );
        bRes = Cudd_bddAnd( dd, bTemp = bRes, Cudd_Not(bVar) );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    dd->TimeStop = TimeStop;
    return bRes;
}